

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

uint rf_load_shader_program(uint v_shader_id,uint f_shader_id)

{
  char local_438 [8];
  char log [1024];
  int length;
  int max_len;
  int local_18;
  uint local_14;
  int success;
  uint program;
  uint f_shader_id_local;
  uint v_shader_id_local;
  
  local_14 = 0;
  local_18 = 0;
  success = f_shader_id;
  program = v_shader_id;
  local_14 = (*(rf__ctx->field_0).gfx_ctx.gl.CreateProgram)();
  (*(rf__ctx->field_0).gfx_ctx.gl.AttachShader)(local_14,program);
  (*(rf__ctx->field_0).gfx_ctx.gl.AttachShader)(local_14,success);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindAttribLocation)(local_14,0,"vertex_position");
  (*(rf__ctx->field_0).gfx_ctx.gl.BindAttribLocation)(local_14,1,"vertex_tex_coord");
  (*(rf__ctx->field_0).gfx_ctx.gl.BindAttribLocation)(local_14,2,"vertex_normal");
  (*(rf__ctx->field_0).gfx_ctx.gl.BindAttribLocation)(local_14,3,"vertex_color");
  (*(rf__ctx->field_0).gfx_ctx.gl.BindAttribLocation)(local_14,4,"vertex_tangent");
  (*(rf__ctx->field_0).gfx_ctx.gl.BindAttribLocation)(local_14,5,"vertex_tex_coord2");
  (*(rf__ctx->field_0).gfx_ctx.gl.LinkProgram)(local_14);
  (*(rf__ctx->field_0).gfx_ctx.gl.GetProgramiv)(local_14,0x8b82,&local_18);
  if (local_18 == 0) {
    rf_log_impl(4,0x1b5a09,(char *)(ulong)local_14);
    log[0x3fc] = '\0';
    log[0x3fd] = '\0';
    log[0x3fe] = '\0';
    log[0x3ff] = '\0';
    (*(rf__ctx->field_0).gfx_ctx.gl.GetProgramiv)(local_14,0x8b84,(int *)(log + 0x3fc));
    (*(rf__ctx->field_0).gfx_ctx.gl.GetProgramInfoLog)
              (local_14,0x400,(int *)(log + 0x3f8),local_438);
    rf_log_impl(2,0x1b33d9,local_438);
    (*(rf__ctx->field_0).gfx_ctx.gl.DeleteProgram)(local_14);
    local_14 = 0;
  }
  else {
    rf_log_impl(2,0x1b5a37,(char *)(ulong)local_14);
  }
  return local_14;
}

Assistant:

RF_INTERNAL unsigned int rf_load_shader_program(unsigned int v_shader_id, unsigned int f_shader_id)
{
    unsigned int program = 0;

    int success = 0;
    program = rf_gl.CreateProgram();

    rf_gl.AttachShader(program, v_shader_id);
    rf_gl.AttachShader(program, f_shader_id);

    // NOTE: Default attribute shader locations must be binded before linking
    rf_gl.BindAttribLocation(program, 0, RF_DEFAULT_ATTRIB_POSITION_NAME);
    rf_gl.BindAttribLocation(program, 1, RF_DEFAULT_ATTRIB_TEXCOORD_NAME);
    rf_gl.BindAttribLocation(program, 2, RF_DEFAULT_ATTRIB_NORMAL_NAME);
    rf_gl.BindAttribLocation(program, 3, RF_DEFAULT_ATTRIB_COLOR_NAME);
    rf_gl.BindAttribLocation(program, 4, RF_DEFAULT_ATTRIB_TANGENT_NAME);
    rf_gl.BindAttribLocation(program, 5, RF_DEFAULT_ATTRIB_TEXCOORD2_NAME);

    // NOTE: If some attrib name is no found on the shader, it locations becomes -1

    rf_gl.LinkProgram(program);

    // NOTE: All uniform variables are intitialised to 0 when a program links

    rf_gl.GetProgramiv(program, GL_LINK_STATUS, &success);

    if (success == GL_FALSE)
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "[SHDR ID %i] Failed to link shader program...", program);

        int max_len = 0;
        int length;

        rf_gl.GetProgramiv(program, GL_INFO_LOG_LENGTH, &max_len);

        char log[1024];

        rf_gl.GetProgramInfoLog(program, 1024, &length, log);

        RF_LOG(RF_LOG_TYPE_INFO, "%s", log);

        rf_gl.DeleteProgram(program);

        program = 0;
    }
    else RF_LOG(RF_LOG_TYPE_INFO, "[SHDR ID %i] rf_shader program loaded successfully", program);

    return program;
}